

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_select_node.cpp
# Opt level: O1

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::Transformer::TransformSelectInternal(Transformer *this,PGSelectStmt *stmt)

{
  Transformer *pTVar1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  PGList *list;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  undefined8 uVar5;
  __node_base select_node;
  Transformer *this_00;
  pointer pQVar6;
  SetOperationNode *pSVar7;
  type node;
  SelectNode *this_01;
  iterator iVar8;
  mapped_type *ppPVar9;
  pointer pDVar10;
  StarExpression *pSVar11;
  InternalException *pIVar12;
  ParserException *pPVar13;
  NotImplementedException *this_02;
  uint uVar14;
  PGSelectStmt *in_RDX;
  pointer *__ptr;
  PGListCell *pPVar15;
  string window_name;
  optional_ptr<duckdb_libpgquery::PGWindowDef,_true> window_def;
  StackChecker<duckdb::Transformer> stack_checker;
  undefined1 local_c8 [16];
  undefined1 local_b8 [40];
  undefined1 local_90 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  __node_base local_60;
  PGSelectStmt *local_58;
  undefined1 local_50 [32];
  
  StackCheck((Transformer *)&local_70,(idx_t)stmt);
  (this->parent).ptr = (Transformer *)0x0;
  if (in_RDX->op - PG_SETOP_UNION < 4) {
    this_00 = (Transformer *)operator_new(0x90);
    SetOperationNode::SetOperationNode((SetOperationNode *)this_00);
    pTVar1 = (this->parent).ptr;
    (this->parent).ptr = this_00;
    if (pTVar1 != (Transformer *)0x0) {
      (*(code *)((pTVar1->parent).ptr)->options)();
    }
    pQVar6 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                       ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
                         *)this);
    pSVar7 = QueryNode::Cast<duckdb::SetOperationNode>(pQVar6);
    if ((Transformer *)in_RDX->withClause != (Transformer *)0x0) {
      local_c8._0_8_ = (Transformer *)in_RDX->withClause;
      optional_ptr<duckdb_libpgquery::PGWithClause,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGWithClause,_true> *)local_c8);
      uVar5 = local_c8._0_8_;
      pQVar6 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
               operator->((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
                           *)this);
      TransformCTE((Transformer *)stmt,(PGWithClause *)uVar5,&pQVar6->cte_map);
    }
    TransformSelectNode((Transformer *)local_c8,(PGNode *)stmt,SUB81(in_RDX->larg,0));
    uVar5 = local_c8._0_8_;
    local_c8._0_8_ = (Transformer *)0x0;
    _Var2._M_head_impl =
         (pSVar7->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
         ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar7->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
    .super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)uVar5;
    if (_Var2._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
    }
    if ((Transformer *)local_c8._0_8_ != (Transformer *)0x0) {
      (**(code **)(*(long *)local_c8._0_8_ + 8))();
    }
    TransformSelectNode((Transformer *)local_c8,(PGNode *)stmt,SUB81(in_RDX->rarg,0));
    uVar5 = local_c8._0_8_;
    local_c8._0_8_ = (Transformer *)0x0;
    _Var2._M_head_impl =
         (pSVar7->right).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar7->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)uVar5;
    if (_Var2._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
    }
    if ((Transformer *)local_c8._0_8_ != (Transformer *)0x0) {
      (**(code **)(*(long *)local_c8._0_8_ + 8))();
    }
    if (((pSVar7->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
         ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl == (QueryNode *)0x0) ||
       ((pSVar7->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
        ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
        super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl == (QueryNode *)0x0)) {
      local_b8._16_8_ = this;
      pIVar12 = (InternalException *)__cxa_allocate_exception(0x10);
      local_c8._0_8_ = local_b8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,"Failed to transform setop children.","");
      InternalException::InternalException(pIVar12,(string *)local_c8);
      __cxa_throw(pIVar12,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pSVar7->setop_all = in_RDX->all;
    uVar14 = in_RDX->op - PG_SETOP_UNION;
    if (3 < uVar14) {
      local_b8._16_8_ = this;
      pIVar12 = (InternalException *)__cxa_allocate_exception(0x10);
      local_c8._0_8_ = local_b8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,"Unexpected setop type","");
      InternalException::InternalException(pIVar12,(string *)local_c8);
      __cxa_throw(pIVar12,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pSVar7->setop_type = (SetOperationType)(0x4020301 >> ((char)uVar14 * '\b' & 0x1fU));
    if (in_RDX->sampleOptions != (PGNode *)0x0) {
      local_b8._16_8_ = this;
      pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
      local_c8._0_8_ = local_b8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,"SAMPLE clause is only allowed in regular SELECT statements","")
      ;
      ParserException::ParserException(pPVar13,(string *)local_c8);
      __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    goto LAB_007a8513;
  }
  if (in_RDX->op != PG_SETOP_NONE) {
    local_b8._16_8_ = this;
    this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_c8._0_8_ = local_b8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c8,"Statement type %d not implemented!","");
    NotImplementedException::NotImplementedException<duckdb_libpgquery::PGSetOperation>
              (this_02,(string *)local_c8,in_RDX->op);
    __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_b8._16_8_ = this;
  this_01 = (SelectNode *)operator_new(0xf0);
  SelectNode::SelectNode(this_01);
  pTVar1 = (this->parent).ptr;
  (this->parent).ptr = (Transformer *)this_01;
  if (pTVar1 != (Transformer *)0x0) {
    (*(code *)((pTVar1->parent).ptr)->options)();
  }
  pQVar6 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                     ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *
                      )this);
  local_60._M_nxt = (_Hash_node_base *)QueryNode::Cast<duckdb::SelectNode>(pQVar6);
  if ((Transformer *)in_RDX->withClause != (Transformer *)0x0) {
    local_c8._0_8_ = (Transformer *)in_RDX->withClause;
    optional_ptr<duckdb_libpgquery::PGWithClause,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGWithClause,_true> *)local_c8);
    uVar5 = local_c8._0_8_;
    pQVar6 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                       ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
                         *)this);
    TransformCTE((Transformer *)stmt,(PGWithClause *)uVar5,&pQVar6->cte_map);
  }
  local_b8._32_8_ = stmt;
  local_58 = in_RDX;
  if ((in_RDX->windowClause != (PGList *)0x0) &&
     (pPVar15 = in_RDX->windowClause->head, pPVar15 != (PGListCell *)0x0)) {
    do {
      local_b8._24_8_ = (pPVar15->data).ptr_value;
      optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGWindowDef,_true> *)(local_b8 + 0x18));
      ::std::__cxx11::string::string
                ((string *)local_c8,*(char **)(local_b8._24_8_ + 8),(allocator *)local_90);
      iVar8 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&stmt->pivot,(key_type *)local_c8);
      uVar5 = local_b8._24_8_;
      if (iVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_true>
          ._M_cur != (__node_type *)0x0) {
        pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
        local_90._0_8_ = local_90 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_90,"window \"%s\" is already defined","");
        local_50._0_8_ = local_50 + 0x10;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,local_c8._0_8_,(bool *)local_c8._8_8_ + local_c8._0_8_);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar13,(string *)local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
        __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ppPVar9 = ::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&stmt->pivot,(key_type *)local_c8);
      *ppPVar9 = (mapped_type)uVar5;
      if ((Transformer *)local_c8._0_8_ != (Transformer *)local_b8) {
        operator_delete((void *)local_c8._0_8_);
      }
      pPVar15 = pPVar15->next;
    } while (pPVar15 != (PGListCell *)0x0);
  }
  select_node._M_nxt = local_60._M_nxt;
  stmt = (PGSelectStmt *)local_b8._32_8_;
  list = local_58->distinctClause;
  if (list != (PGList *)0x0) {
    local_c8._0_8_ = operator_new(0x28);
    (((StarExpression *)local_c8._0_8_)->super_ParsedExpression).super_BaseExpression.type = 3;
    (((StarExpression *)local_c8._0_8_)->super_ParsedExpression).super_BaseExpression.
    _vptr_BaseExpression = (_func_int **)&PTR__DistinctModifier_01993400;
    (((StarExpression *)local_c8._0_8_)->super_ParsedExpression).super_BaseExpression.alias.
    _M_dataplus._M_p = (pointer)0x0;
    (((StarExpression *)local_c8._0_8_)->super_ParsedExpression).super_BaseExpression.alias.
    _M_string_length = 0;
    (((StarExpression *)local_c8._0_8_)->super_ParsedExpression).super_BaseExpression.alias.field_2.
    _M_allocated_capacity = 0;
    if ((list->head->data).ptr_value != (void *)0x0) {
      pDVar10 = unique_ptr<duckdb::DistinctModifier,_std::default_delete<duckdb::DistinctModifier>,_true>
                ::operator->((unique_ptr<duckdb::DistinctModifier,_std::default_delete<duckdb::DistinctModifier>,_true>
                              *)local_c8);
      TransformExpressionList((Transformer *)stmt,list,&pDVar10->distinct_on_targets);
    }
    local_90._0_8_ = local_c8._0_8_;
    local_c8._0_8_ = (Transformer *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
                *)(select_node._M_nxt + 2),
               (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                *)local_90);
    if ((StarExpression *)local_90._0_8_ != (StarExpression *)0x0) {
      (*(code *)(*(_Hash_node_base **)local_90._0_8_)[1]._M_nxt)();
    }
    if ((QueryNode *)local_c8._0_8_ != (QueryNode *)0x0) {
      (**(code **)(*(long *)local_c8._0_8_ + 8))();
    }
  }
  this = (Transformer *)local_b8._16_8_;
  if (local_58->valuesLists == (PGList *)0x0) {
    if (local_58->targetList == (PGList *)0x0) {
      pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
      local_c8._0_8_ = local_b8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,"SELECT clause without selection list","");
      ParserException::ParserException(pPVar13,(string *)local_c8);
      __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (local_58->from_first != true) {
      TransformExpressionList
                ((Transformer *)stmt,local_58->targetList,
                 (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  *)(select_node._M_nxt + 0xf));
      TransformFrom((Transformer *)local_c8,(optional_ptr<duckdb_libpgquery::PGList,_true>)stmt);
      uVar5 = local_c8._0_8_;
      local_c8._0_8_ = (StarExpression *)0x0;
      _Var3._M_head_impl =
           *(TableRef **)
            &(((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
              (select_node._M_nxt + 0x12))->
             super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)._M_t.
             super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>;
      (((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
       (select_node._M_nxt + 0x12))->
      super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)._M_t.
      super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_> =
           (_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)uVar5;
      pSVar11 = (StarExpression *)local_c8._0_8_;
      if ((_Head_base<0UL,_duckdb::TableRef_*,_false>)_Var3._M_head_impl !=
          (_Head_base<0UL,_duckdb::TableRef_*,_false>)0x0) {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_TableRef + 8))();
        pSVar11 = (StarExpression *)local_c8._0_8_;
      }
      goto LAB_007a886e;
    }
    TransformFrom((Transformer *)local_c8,(optional_ptr<duckdb_libpgquery::PGList,_true>)stmt);
    uVar5 = local_c8._0_8_;
    local_c8._0_8_ = (StarExpression *)0x0;
    _Var3._M_head_impl =
         *(TableRef **)
          &(((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
            (select_node._M_nxt + 0x12))->
           super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)._M_t.
           super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>;
    (((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
     (select_node._M_nxt + 0x12))->
    super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)._M_t.
    super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_> =
         (_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)uVar5;
    if ((_Head_base<0UL,_duckdb::TableRef_*,_false>)_Var3._M_head_impl !=
        (_Head_base<0UL,_duckdb::TableRef_*,_false>)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_TableRef + 8))();
    }
    if ((StarExpression *)local_c8._0_8_ != (StarExpression *)0x0) {
      (**(code **)(*(long *)local_c8._0_8_ + 8))();
    }
    TransformExpressionList
              ((Transformer *)stmt,local_58->targetList,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)(select_node._M_nxt + 0xf));
  }
  else {
    TransformValuesList((Transformer *)local_c8,(PGList *)stmt);
    uVar5 = local_c8._0_8_;
    local_c8._0_8_ = (Transformer *)0x0;
    _Var3._M_head_impl =
         *(TableRef **)
          &(((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
            (select_node._M_nxt + 0x12))->
           super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)._M_t.
           super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>;
    (((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
     (select_node._M_nxt + 0x12))->
    super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)._M_t.
    super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_> =
         (_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)uVar5;
    if ((_Head_base<0UL,_duckdb::TableRef_*,_false>)_Var3._M_head_impl !=
        (_Head_base<0UL,_duckdb::TableRef_*,_false>)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_TableRef + 8))();
    }
    pSVar11 = (StarExpression *)operator_new(0x110);
    local_c8._8_8_ = (ParserOptions *)0x0;
    local_b8[0] = '\0';
    local_c8._0_8_ = (StarExpression *)local_b8;
    StarExpression::StarExpression(pSVar11,(string *)local_c8);
    if ((StarExpression *)local_c8._0_8_ != (StarExpression *)local_b8) {
      operator_delete((void *)local_c8._0_8_);
    }
    this = (Transformer *)local_b8._16_8_;
    local_90._0_8_ = pSVar11;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)(select_node._M_nxt + 0xf),
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_90);
    pSVar11 = (StarExpression *)local_90._0_8_;
LAB_007a886e:
    if (pSVar11 != (StarExpression *)0x0) {
      (*(pSVar11->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[1])();
    }
  }
  TransformExpression((Transformer *)local_c8,(optional_ptr<duckdb_libpgquery::PGNode,_true>)stmt);
  uVar5 = local_c8._0_8_;
  local_c8._0_8_ = (Transformer *)0x0;
  _Var4._M_head_impl =
       *(ParsedExpression **)
        &(((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            *)(select_node._M_nxt + 0x13))->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  ;
  (((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *)
   (select_node._M_nxt + 0x13))->
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       = (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )uVar5;
  if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)_Var4._M_head_impl !=
      (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
    (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
  }
  if ((Transformer *)local_c8._0_8_ != (Transformer *)0x0) {
    (**(code **)(*(long *)local_c8._0_8_ + 8))();
  }
  TransformGroupBy((Transformer *)stmt,local_58->groupClause,(SelectNode *)select_node._M_nxt);
  TransformExpression((Transformer *)local_c8,(optional_ptr<duckdb_libpgquery::PGNode,_true>)stmt);
  uVar5 = local_c8._0_8_;
  local_c8._0_8_ = (Transformer *)0x0;
  _Var4._M_head_impl =
       *(ParsedExpression **)
        &(((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            *)(select_node._M_nxt + 0x1a))->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  ;
  (((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *)
   (select_node._M_nxt + 0x1a))->
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       = (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )uVar5;
  if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)_Var4._M_head_impl !=
      (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
    (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
  }
  if ((ParsedExpression *)local_c8._0_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_c8._0_8_ + 8))();
  }
  TransformExpression((Transformer *)local_c8,(optional_ptr<duckdb_libpgquery::PGNode,_true>)stmt);
  uVar5 = local_c8._0_8_;
  local_c8._0_8_ = (Transformer *)0x0;
  _Var4._M_head_impl =
       *(ParsedExpression **)
        &(((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            *)(select_node._M_nxt + 0x1b))->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  ;
  (((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *)
   (select_node._M_nxt + 0x1b))->
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       = (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )uVar5;
  if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)_Var4._M_head_impl !=
      (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
    (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
  }
  if ((Transformer *)local_c8._0_8_ != (Transformer *)0x0) {
    (**(code **)(*(long *)local_c8._0_8_ + 8))();
  }
  TransformSampleOptions
            ((Transformer *)local_c8,(optional_ptr<duckdb_libpgquery::PGNode,_true>)stmt);
  uVar5 = local_c8._0_8_;
  local_c8._0_8_ = (Transformer *)0x0;
  ::std::__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::reset
            ((__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *)
             (select_node._M_nxt + 0x1d),(pointer)uVar5);
  uVar5 = local_c8._0_8_;
  in_RDX = local_58;
  if ((Transformer *)local_c8._0_8_ != (Transformer *)0x0) {
    Value::~Value((Value *)local_c8._0_8_);
    operator_delete((void *)uVar5);
  }
LAB_007a8513:
  node = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
                   ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
                    this);
  TransformModifiers((Transformer *)stmt,in_RDX,node);
  *(__buckets_ptr)(local_70._M_allocated_capacity + 200) =
       (__node_base_ptr)
       ((long)*(__buckets_ptr)(local_70._M_allocated_capacity + 200) - local_70._8_8_);
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (_Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>)this;
}

Assistant:

unique_ptr<QueryNode> Transformer::TransformSelectInternal(duckdb_libpgquery::PGSelectStmt &stmt) {
	D_ASSERT(stmt.type == duckdb_libpgquery::T_PGSelectStmt);
	auto stack_checker = StackCheck();

	unique_ptr<QueryNode> node;

	switch (stmt.op) {
	case duckdb_libpgquery::PG_SETOP_NONE: {
		node = make_uniq<SelectNode>();
		auto &result = node->Cast<SelectNode>();
		if (stmt.withClause) {
			TransformCTE(*PGPointerCast<duckdb_libpgquery::PGWithClause>(stmt.withClause), node->cte_map);
		}
		if (stmt.windowClause) {
			for (auto window_ele = stmt.windowClause->head; window_ele != nullptr; window_ele = window_ele->next) {
				auto window_def = PGPointerCast<duckdb_libpgquery::PGWindowDef>(window_ele->data.ptr_value);
				D_ASSERT(window_def);
				D_ASSERT(window_def->name);
				string window_name(window_def->name);
				auto it = window_clauses.find(window_name);
				if (it != window_clauses.end()) {
					throw ParserException("window \"%s\" is already defined", window_name);
				}
				window_clauses[window_name] = window_def.get();
			}
		}

		// checks distinct clause
		if (stmt.distinctClause != nullptr) {
			auto modifier = make_uniq<DistinctModifier>();
			// checks distinct on clause
			auto target = PGPointerCast<duckdb_libpgquery::PGNode>(stmt.distinctClause->head->data.ptr_value);
			if (target) {
				//  add the columns defined in the ON clause to the select list
				TransformExpressionList(*stmt.distinctClause, modifier->distinct_on_targets);
			}
			result.modifiers.push_back(std::move(modifier));
		}

		// do this early so the value lists also have a `FROM`
		if (stmt.valuesLists) {
			// VALUES list, create an ExpressionList
			D_ASSERT(!stmt.fromClause);
			result.from_table = TransformValuesList(stmt.valuesLists);
			result.select_list.push_back(make_uniq<StarExpression>());
		} else {
			if (!stmt.targetList) {
				throw ParserException("SELECT clause without selection list");
			}
			// transform in the specified order to ensure positional parameters are correctly set
			if (stmt.from_first) {
				result.from_table = TransformFrom(stmt.fromClause);
				TransformExpressionList(*stmt.targetList, result.select_list);
			} else {
				TransformExpressionList(*stmt.targetList, result.select_list);
				result.from_table = TransformFrom(stmt.fromClause);
			}
		}

		// where
		result.where_clause = TransformExpression(stmt.whereClause);
		// group by
		TransformGroupBy(stmt.groupClause, result);
		// having
		result.having = TransformExpression(stmt.havingClause);
		// qualify
		result.qualify = TransformExpression(stmt.qualifyClause);
		// sample
		result.sample = TransformSampleOptions(stmt.sampleOptions);
		break;
	}
	case duckdb_libpgquery::PG_SETOP_UNION:
	case duckdb_libpgquery::PG_SETOP_EXCEPT:
	case duckdb_libpgquery::PG_SETOP_INTERSECT:
	case duckdb_libpgquery::PG_SETOP_UNION_BY_NAME: {
		node = make_uniq<SetOperationNode>();
		auto &result = node->Cast<SetOperationNode>();
		if (stmt.withClause) {
			TransformCTE(*PGPointerCast<duckdb_libpgquery::PGWithClause>(stmt.withClause), node->cte_map);
		}
		result.left = TransformSelectNode(*stmt.larg);
		result.right = TransformSelectNode(*stmt.rarg);
		if (!result.left || !result.right) {
			throw InternalException("Failed to transform setop children.");
		}

		result.setop_all = stmt.all;
		switch (stmt.op) {
		case duckdb_libpgquery::PG_SETOP_UNION:
			result.setop_type = SetOperationType::UNION;
			break;
		case duckdb_libpgquery::PG_SETOP_EXCEPT:
			result.setop_type = SetOperationType::EXCEPT;
			break;
		case duckdb_libpgquery::PG_SETOP_INTERSECT:
			result.setop_type = SetOperationType::INTERSECT;
			break;
		case duckdb_libpgquery::PG_SETOP_UNION_BY_NAME:
			result.setop_type = SetOperationType::UNION_BY_NAME;
			break;
		default:
			throw InternalException("Unexpected setop type");
		}
		if (stmt.sampleOptions) {
			throw ParserException("SAMPLE clause is only allowed in regular SELECT statements");
		}
		break;
	}
	default:
		throw NotImplementedException("Statement type %d not implemented!", stmt.op);
	}

	TransformModifiers(stmt, *node);

	return node;
}